

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minireflect.h
# Opt level: O3

void __thiscall flatbuffers::ToStringVisitor::EndSequence(ToStringVisitor *this)

{
  std::__cxx11::string::_M_append((char *)&this->s,(ulong)(this->d)._M_dataplus._M_p);
  this->indent_level = this->indent_level - 1;
  append_indent(this);
  std::__cxx11::string::append((char *)&this->s);
  return;
}

Assistant:

void EndSequence() {
    s += d;
    indent_level--;
    append_indent();
    s += "}";
  }